

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

string * __thiscall
pbrt::Triangle::ToString_abi_cxx11_(string *__return_storage_ptr__,Triangle *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar4 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar6 = (long)this->triIndex;
  lVar5 = *(long *)(lVar4 + 8);
  iVar1 = *(int *)(lVar5 + lVar6 * 0xc);
  lVar4 = *(long *)(lVar4 + 0x10);
  iVar2 = *(int *)(lVar5 + 4 + lVar6 * 0xc);
  iVar3 = *(int *)(lVar5 + 8 + lVar6 * 0xc);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<int_const&,int_const&,pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Point3<float>const&>
            (__return_storage_ptr__,"[ Triangle meshIndex: %d triIndex: %d -> p [ %s %s %s ] ]",
             &this->meshIndex,&this->triIndex,(Point3<float> *)(lVar4 + (long)iVar1 * 0xc),
             (Point3<float> *)(lVar4 + (long)iVar2 * 0xc),
             (Point3<float> *)(lVar4 + (long)iVar3 * 0xc));
  return __return_storage_ptr__;
}

Assistant:

std::string Triangle::ToString() const {
    // Get triangle vertices in _p0_, _p1_, and _p2_
    auto mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    const Point3f &p0 = mesh->p[v[0]];
    const Point3f &p1 = mesh->p[v[1]];
    const Point3f &p2 = mesh->p[v[2]];

    return StringPrintf("[ Triangle meshIndex: %d triIndex: %d -> p [ %s %s %s ] ]",
                        meshIndex, triIndex, p0, p1, p2);
}